

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqlfield.cpp
# Opt level: O2

void QSqlField::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVariant *pQVar1;
  undefined8 uVar2;
  PrivateShared *pPVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == WriteProperty) {
    if ((uint)_id < 0xb) {
      pQVar1 = (QVariant *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setValue((QSqlField *)_o,pQVar1);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDefaultValue((QSqlField *)_o,pQVar1);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setName((QSqlField *)_o,(QString *)pQVar1);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTableName((QSqlField *)_o,(QString *)pQVar1);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMetaType((QSqlField *)_o,(QMetaTypeInterface *)(pQVar1->d).data.shared);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setRequiredStatus((QSqlField *)_o,*(RequiredStatus *)&(pQVar1->d).data);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setReadOnly((QSqlField *)_o,(bool)(pQVar1->d).data.data[0]);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setGenerated((QSqlField *)_o,(bool)(pQVar1->d).data.data[0]);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAutoValue((QSqlField *)_o,(bool)(pQVar1->d).data.data[0]);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setLength((QSqlField *)_o,*(int *)&(pQVar1->d).data);
          return;
        }
        break;
      case 10:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setPrecision((QSqlField *)_o,*(int *)&(pQVar1->d).data);
          return;
        }
      }
      goto LAB_00120b23;
    }
    goto LAB_00120aa2;
  }
  if ((_c != ReadProperty) || (10 < (uint)_id)) goto LAB_00120aa2;
  pQVar1 = (QVariant *)*_a;
  switch(_id) {
  case 0:
    QVariant::QVariant((QVariant *)&local_38,(QVariant *)_o);
    goto LAB_001209cc;
  case 1:
    defaultValue((QVariant *)&local_38,(QSqlField *)_o);
LAB_001209cc:
    QVariant::operator=(pQVar1,(QVariant *)&local_38);
    QVariant::~QVariant((QVariant *)&local_38);
    goto LAB_00120aa2;
  case 2:
    name((QString *)&local_38,(QSqlField *)_o);
    goto LAB_0012097e;
  case 3:
    tableName((QString *)&local_38,(QSqlField *)_o);
LAB_0012097e:
    pPVar3 = (pQVar1->d).data.shared;
    uVar4 = *(undefined8 *)((long)&(pQVar1->d).data + 8);
    (pQVar1->d).data.shared = local_38.shared;
    *(undefined8 *)((long)&(pQVar1->d).data + 8) = local_38._8_8_;
    uVar2 = *(undefined8 *)((long)&(pQVar1->d).data + 0x10);
    *(undefined8 *)((long)&(pQVar1->d).data + 0x10) = local_38._16_8_;
    local_38.shared = pPVar3;
    local_38._8_8_ = uVar4;
    local_38._16_8_ = uVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
    goto LAB_00120aa2;
  case 4:
    (pQVar1->d).data.shared = *(PrivateShared **)(*(long *)(_o + 0x20) + 0x58);
    goto LAB_00120aa2;
  case 5:
    uVar6 = *(undefined4 *)(*(long *)(_o + 0x20) + 0x60);
    break;
  case 6:
    bVar5 = *(byte *)(*(long *)(_o + 0x20) + 0x70);
    goto LAB_00120a9e;
  case 7:
    bVar5 = *(byte *)(*(long *)(_o + 0x20) + 0x70) >> 1;
    goto LAB_00120a9e;
  case 8:
    bVar5 = *(byte *)(*(long *)(_o + 0x20) + 0x70) >> 2;
LAB_00120a9e:
    (pQVar1->d).data.data[0] = bVar5 & 1;
    goto LAB_00120aa2;
  case 9:
    uVar6 = *(undefined4 *)(*(long *)(_o + 0x20) + 100);
    break;
  case 10:
    uVar6 = *(undefined4 *)(*(long *)(_o + 0x20) + 0x68);
  }
  *(undefined4 *)&(pQVar1->d).data = uVar6;
LAB_00120aa2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00120b23:
  __stack_chk_fail();
}

Assistant:

void QSqlField::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlField *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->value(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->defaultValue(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->tableName(); break;
        case 4: *reinterpret_cast<QMetaType*>(_v) = _t->metaType(); break;
        case 5: *reinterpret_cast<RequiredStatus*>(_v) = _t->requiredStatus(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isGenerated(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isAutoValue(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->length(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->precision(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setDefaultValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 2: _t->setName(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setTableName(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setMetaType(*reinterpret_cast<QMetaType*>(_v)); break;
        case 5: _t->setRequiredStatus(*reinterpret_cast<RequiredStatus*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setGenerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoValue(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setPrecision(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}